

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QString * __thiscall
QRegularExpression::wildcardToRegularExpression
          (QString *__return_storage_ptr__,QRegularExpression *this,QStringView pattern,
          WildcardConversionOptions options)

{
  qsizetype qVar1;
  Data *pDVar2;
  QRegularExpression *pQVar3;
  char16_t *pcVar4;
  char16_t *str;
  ulong uVar5;
  long lVar6;
  QRegularExpression *pQVar7;
  QRegularExpression *pQVar8;
  QChar QVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  lVar6 = pattern.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  QString::reserve(__return_storage_ptr__,(long)&(this->d).d.ptr + (long)this / 0x10);
  bVar10 = ((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0;
  pcVar4 = L".*";
  if (bVar10) {
    pcVar4 = L"[^/]*";
  }
  str = L".";
  if (bVar10) {
    str = L"[^/]";
  }
  QString::append(__return_storage_ptr__,(QChar *)L"(?s:",4);
  pQVar3 = (QRegularExpression *)0x0;
LAB_003a7984:
  pQVar7 = pQVar3;
  if ((long)this <= (long)pQVar7) {
    QString::append(__return_storage_ptr__,(QChar *)0x464008,1);
    if (((undefined1  [16])pattern & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      anchoredPattern((QString *)&local_58,__return_storage_ptr__);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar4;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
LAB_003a7b26:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return __return_storage_ptr__;
  }
  pQVar8 = (QRegularExpression *)((long)&(pQVar7->d).d.ptr + 1);
  QVar9.ucs = *(char16_t *)(lVar6 + (long)pQVar7 * 2);
  uVar5 = (ulong)((ushort)QVar9.ucs - 0x2b);
  pQVar3 = pQVar8;
  if ((ushort)QVar9.ucs - 0x2b < 0x34) {
    if ((0xa000000000009U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_003a79f6;
    if (uVar5 == 0x14) {
      QString::append(__return_storage_ptr__,(QChar *)str,(ulong)bVar10 * 3 + 1);
    }
    else {
      if (uVar5 != 0x30) goto LAB_003a79a4;
      QString::append(__return_storage_ptr__,(QChar)0x5b);
      if ((long)pQVar8 < (long)this) {
        if (*(short *)(lVar6 + 2 + (long)pQVar7 * 2) == 0x21) {
          QString::append(__return_storage_ptr__,(QChar)0x5e);
          pQVar8 = (QRegularExpression *)((long)&(pQVar7->d).d.ptr + 2);
        }
        if (((long)pQVar8 < (long)this) && (*(short *)(lVar6 + (long)pQVar8 * 2) == 0x5d)) {
          QString::append(__return_storage_ptr__,(QChar)0x5d);
          pQVar8 = (QRegularExpression *)((long)&(pQVar8->d).d.ptr + 1);
        }
        for (; (pQVar3 = pQVar8, (long)pQVar8 < (long)this &&
               (QVar9.ucs = *(char16_t *)(lVar6 + (long)pQVar8 * 2), QVar9.ucs != L']'));
            pQVar8 = (QRegularExpression *)((long)&(pQVar8->d).d.ptr + 1)) {
          if (((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
            if (QVar9.ucs == L'\\') {
LAB_003a7a9e:
              QString::append(__return_storage_ptr__,(QChar)0x5c);
              QVar9.ucs = *(char16_t *)(lVar6 + (long)pQVar8 * 2);
            }
            else if (QVar9.ucs == L'/') goto LAB_003a7b26;
          }
          else if (QVar9.ucs == L'\\') goto LAB_003a7a9e;
          QString::append(__return_storage_ptr__,QVar9);
        }
      }
    }
    goto LAB_003a7984;
  }
LAB_003a79a4:
  if ((((ushort)QVar9.ucs - 0x7b < 3) || ((ushort)QVar9.ucs - 0x28 < 2)) || (QVar9.ucs == L'$')) {
LAB_003a79f6:
    QString::append(__return_storage_ptr__,(QChar)0x5c);
  }
  else if (QVar9.ucs == L'*') {
    QString::append(__return_storage_ptr__,(QChar *)pcVar4,(ulong)bVar10 * 3 + 2);
    for (; (pQVar3 = this, (long)pQVar8 < (long)this &&
           (pQVar3 = pQVar8, *(short *)(lVar6 + (long)pQVar8 * 2) == 0x2a));
        pQVar8 = (QRegularExpression *)((long)&(pQVar8->d).d.ptr + 1)) {
    }
    goto LAB_003a7984;
  }
  QString::append(__return_storage_ptr__,QVar9);
  goto LAB_003a7984;
}

Assistant:

QString QRegularExpression::wildcardToRegularExpression(QStringView pattern, WildcardConversionOptions options)
{
    const qsizetype wclen = pattern.size();
    QString rx;
    rx.reserve(wclen + wclen / 16);
    qsizetype i = 0;
    const QChar *wc = pattern.data();

    struct GlobSettings {
        char16_t nativePathSeparator;
        QStringView starEscape;
        QStringView questionMarkEscape;
    };

    const GlobSettings settings = [options]() {
        if (options.testFlag(NonPathWildcardConversion)) {
            return GlobSettings{ u'\0', u".*", u"." };
        } else {
#ifdef Q_OS_WIN
            return GlobSettings{ u'\\', u"[^/\\\\]*", u"[^/\\\\]" };
#else
            return GlobSettings{ u'/', u"[^/]*", u"[^/]" };
#endif
        }
    }();

    // We want a dot to match everything (incl. newlines), so enable /s mode,
    // limited to the pattern string we're producing.
    rx += u"(?s:";

    while (i < wclen) {
        const QChar c = wc[i++];
        switch (c.unicode()) {
        case '*':
            rx += settings.starEscape;
            // Coalesce sequences of *
            while (i < wclen && wc[i] == u'*')
                ++i;
            break;
        case '?':
            rx += settings.questionMarkEscape;
            break;
        // When not using filepath globbing: \ is escaped, / is itself
        // When using filepath globbing:
        // * Unix: \ gets escaped. / is itself
        // * Windows: \ and / can match each other -- they become [/\\] in regexp
        case '\\':
#ifdef Q_OS_WIN
            if (options.testFlag(NonPathWildcardConversion))
                rx += u"\\\\";
            else
                rx += u"[/\\\\]";
            break;
        case '/':
            if (options.testFlag(NonPathWildcardConversion))
                rx += u'/';
            else
                rx += u"[/\\\\]";
            break;
#endif
        case '$':
        case '(':
        case ')':
        case '+':
        case '.':
        case '^':
        case '{':
        case '|':
        case '}':
            rx += u'\\';
            rx += c;
            break;
        case '[':
            rx += c;
            // Support for the [!abc] or [!a-c] syntax
            if (i < wclen) {
                if (wc[i] == u'!') {
                    rx += u'^';
                    ++i;
                }

                if (i < wclen && wc[i] == u']')
                    rx += wc[i++];

                while (i < wclen && wc[i] != u']') {
                    if (!options.testFlag(NonPathWildcardConversion)) {
                        // The '/' appearing in a character class invalidates the
                        // regular expression parsing. It also concerns '\\' on
                        // Windows OS types.
                        if (wc[i] == u'/' || wc[i] == settings.nativePathSeparator)
                            return rx;
                    }
                    if (wc[i] == u'\\')
                        rx += u'\\';
                    rx += wc[i++];
                }
            }
            break;
        default:
            rx += c;
            break;
        }
    }

    // Closes the (?s: group opened above
    rx += u")";

    if (!(options & UnanchoredWildcardConversion))
        rx = anchoredPattern(rx);

    return rx;
}